

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtype-exprs.h
# Opt level: O0

void __thiscall
wasm::SubtypingDiscoverer<NullFixer>::visitStructNew
          (SubtypingDiscoverer<NullFixer> *this,StructNew *curr)

{
  Expression *a;
  bool bVar1;
  size_type sVar2;
  size_t sVar3;
  NullFixer *this_00;
  Expression **ppEVar4;
  const_reference pvVar5;
  size_t size;
  size_t i;
  Struct *local_20;
  FieldList *fields;
  StructNew *curr_local;
  SubtypingDiscoverer<NullFixer> *this_local;
  
  fields = (FieldList *)curr;
  curr_local = (StructNew *)this;
  bVar1 = wasm::Type::isStruct
                    (&(curr->super_SpecificExpression<(wasm::Expression::Id)65>).super_Expression.
                      type);
  if ((bVar1) && (bVar1 = StructNew::isWithDefault((StructNew *)fields), !bVar1)) {
    i = (size_t)wasm::Type::getHeapType
                          ((Type *)&(fields->
                                    super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>).
                                    _M_impl.super__Vector_impl_data._M_finish);
    local_20 = HeapType::getStruct((HeapType *)&i);
    sVar2 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::size(&local_20->fields);
    sVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                      ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                       &(fields->super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>).
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (sVar2 != sVar3) {
      __assert_fail("fields.size() == curr->operands.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/subtype-exprs.h"
                    ,0x13a,
                    "void wasm::SubtypingDiscoverer<NullFixer>::visitStructNew(StructNew *) [SubType = NullFixer]"
                   );
    }
    size = 0;
    sVar2 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::size(&local_20->fields);
    for (; size < sVar2; size = size + 1) {
      this_00 = self(this);
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           &(fields->super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>).
                            _M_impl.super__Vector_impl_data._M_end_of_storage,size);
      a = *ppEVar4;
      pvVar5 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::operator[]
                         (&local_20->fields,size);
      StringLowering::replaceNulls(wasm::Module*)::NullFixer::noteSubtype(wasm::Expression*,wasm::
      Type_(this_00,a,(Type)(pvVar5->type).id);
    }
  }
  return;
}

Assistant:

void visitStructNew(StructNew* curr) {
    if (!curr->type.isStruct() || curr->isWithDefault()) {
      return;
    }
    const auto& fields = curr->type.getHeapType().getStruct().fields;
    assert(fields.size() == curr->operands.size());
    for (size_t i = 0, size = fields.size(); i < size; ++i) {
      self()->noteSubtype(curr->operands[i], fields[i].type);
    }
  }